

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::convert_double_to_string_abi_cxx11_
          (CompilerGLSL *this,SPIRConstant *c,uint32_t col,uint32_t row)

{
  bool bVar1;
  uint uVar2;
  CompilerError *pCVar3;
  char *pcVar4;
  undefined4 in_register_00000014;
  uint32_t in_R8D;
  double __value;
  double dVar5;
  spirv_cross local_460 [38];
  undefined1 local_43a;
  allocator local_439;
  string local_438 [39];
  allocator local_411;
  string local_410 [38];
  undefined1 local_3ea;
  allocator local_3e9;
  string local_3e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8 [32];
  spirv_cross local_3a8 [32];
  char local_388 [8];
  char print_buffer [64];
  allocator local_339;
  string local_338 [38];
  undefined1 local_312;
  allocator local_311;
  string local_310 [32];
  uint64_t local_2f0;
  uint64_t u64_value;
  SPIRType in_type;
  SPIRType out_type;
  double double_value;
  uint32_t row_local;
  uint32_t col_local;
  SPIRConstant *c_local;
  CompilerGLSL *this_local;
  string *res;
  
  ::std::__cxx11::string::string((string *)this);
  __value = SPIRConstant::scalar_f64((SPIRConstant *)CONCAT44(in_register_00000014,col),row,in_R8D);
  uVar2 = ::std::isnan(__value);
  if (((uVar2 & 1) == 0) && (uVar2 = ::std::isinf(__value), (uVar2 & 1) == 0)) {
    convert_to_string_abi_cxx11_(local_460,__value,(char)c[0x19].m.id[0].id);
    ::std::__cxx11::string::operator=((string *)this,(string *)local_460);
    ::std::__cxx11::string::~string((string *)local_460);
    if ((c[0x16].m.c[2].id[0].id & 0x100) != 0) {
      ::std::__cxx11::string::operator+=((string *)this,"lf");
    }
  }
  else {
    bVar1 = is_legacy((CompilerGLSL *)c);
    if (bVar1) {
      if ((c[0x14].m.id[1].id & 1) != 0) {
        local_3ea = 1;
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_3e8,"FP64 not supported in ES profile.",&local_3e9);
        CompilerError::CompilerError(pCVar3,(string *)local_3e8);
        local_3ea = 0;
        __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (c[0x14].m.id[0].id < 400) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_410,"GL_ARB_gpu_shader_fp64",&local_411);
        require_extension_internal((CompilerGLSL *)c,(string *)local_410);
        ::std::__cxx11::string::~string(local_410);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_411);
      }
      dVar5 = ::std::numeric_limits<double>::infinity();
      if ((__value != dVar5) || (NAN(__value) || NAN(dVar5))) {
        dVar5 = ::std::numeric_limits<double>::infinity();
        if ((__value != -dVar5) || (NAN(__value) || NAN(-dVar5))) {
          uVar2 = ::std::isnan(__value);
          if ((uVar2 & 1) == 0) {
            local_43a = 1;
            pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_438,"Cannot represent non-finite floating point constant.",&local_439);
            CompilerError::CompilerError(pCVar3,(string *)local_438);
            local_43a = 0;
            __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if ((c[0x16].m.c[2].id[0].id & 0x100) == 0) {
            ::std::__cxx11::string::operator=((string *)this,"(0.0 / 0.0)");
          }
          else {
            ::std::__cxx11::string::operator=((string *)this,"(0.0lf / 0.0lf)");
          }
        }
        else if ((c[0x16].m.c[2].id[0].id & 0x100) == 0) {
          ::std::__cxx11::string::operator=((string *)this,"(-1.0 / 0.0)");
        }
        else {
          ::std::__cxx11::string::operator=((string *)this,"(-1.0lf / 0.0lf)");
        }
      }
      else if ((c[0x16].m.c[2].id[0].id & 0x100) == 0) {
        ::std::__cxx11::string::operator=((string *)this,"(1.0 / 0.0)");
      }
      else {
        ::std::__cxx11::string::operator=((string *)this,"(1.0lf / 0.0lf)");
      }
    }
    else {
      SPIRType::SPIRType((SPIRType *)&in_type.member_name_cache._M_h._M_single_bucket);
      SPIRType::SPIRType((SPIRType *)&u64_value);
      in_type.super_IVariant._vptr_IVariant._4_4_ = 10;
      in_type.super_IVariant._12_4_ = 1;
      in_type.super_IVariant.self.id = 0x40;
      local_2f0 = SPIRConstant::scalar_u64
                            ((SPIRConstant *)CONCAT44(in_register_00000014,col),row,in_R8D);
      if ((c[0x14].m.id[1].id & 1) != 0) {
        local_312 = 1;
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_310,"64-bit integers/float not supported in ES profile.",&local_311);
        CompilerError::CompilerError(pCVar3,(string *)local_310);
        local_312 = 0;
        __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_338,"GL_ARB_gpu_shader_int64",&local_339);
      require_extension_internal((CompilerGLSL *)c,(string *)local_338);
      ::std::__cxx11::string::~string(local_338);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_339);
      pcVar4 = "ul";
      if ((c[0x16].m.c[2].id[0].id & 0x1000000) != 0) {
        pcVar4 = "ull";
      }
      sprintf(local_388,"0x%llx%s",local_2f0,pcVar4);
      (*(c->super_IVariant)._vptr_IVariant[0x34])
                (local_3c8,c,&in_type.member_name_cache._M_h._M_single_bucket,&u64_value);
      join<std::__cxx11::string,char_const(&)[2],char(&)[64],char_const(&)[2]>
                (local_3a8,local_3c8,(char (*) [2])0x4f3f9c,(char (*) [64])local_388,
                 (char (*) [2])0x4dff7a);
      ::std::__cxx11::string::operator=((string *)this,(string *)local_3a8);
      ::std::__cxx11::string::~string((string *)local_3a8);
      ::std::__cxx11::string::~string((string *)local_3c8);
      SPIRType::~SPIRType((SPIRType *)&u64_value);
      SPIRType::~SPIRType((SPIRType *)&in_type.member_name_cache._M_h._M_single_bucket);
    }
  }
  return this;
}

Assistant:

std::string CompilerGLSL::convert_double_to_string(const SPIRConstant &c, uint32_t col, uint32_t row)
{
	string res;
	double double_value = c.scalar_f64(col, row);

	if (std::isnan(double_value) || std::isinf(double_value))
	{
		// Use special representation.
		if (!is_legacy())
		{
			SPIRType out_type;
			SPIRType in_type;
			out_type.basetype = SPIRType::Double;
			in_type.basetype = SPIRType::UInt64;
			out_type.vecsize = 1;
			in_type.vecsize = 1;
			out_type.width = 64;
			in_type.width = 64;

			uint64_t u64_value = c.scalar_u64(col, row);

			if (options.es)
				SPIRV_CROSS_THROW("64-bit integers/float not supported in ES profile.");
			require_extension_internal("GL_ARB_gpu_shader_int64");

			char print_buffer[64];
			sprintf(print_buffer, "0x%llx%s", static_cast<unsigned long long>(u64_value),
			        backend.long_long_literal_suffix ? "ull" : "ul");
			res = join(bitcast_glsl_op(out_type, in_type), "(", print_buffer, ")");
		}
		else
		{
			if (options.es)
				SPIRV_CROSS_THROW("FP64 not supported in ES profile.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_gpu_shader_fp64");

			if (double_value == numeric_limits<double>::infinity())
			{
				if (backend.double_literal_suffix)
					res = "(1.0lf / 0.0lf)";
				else
					res = "(1.0 / 0.0)";
			}
			else if (double_value == -numeric_limits<double>::infinity())
			{
				if (backend.double_literal_suffix)
					res = "(-1.0lf / 0.0lf)";
				else
					res = "(-1.0 / 0.0)";
			}
			else if (std::isnan(double_value))
			{
				if (backend.double_literal_suffix)
					res = "(0.0lf / 0.0lf)";
				else
					res = "(0.0 / 0.0)";
			}
			else
				SPIRV_CROSS_THROW("Cannot represent non-finite floating point constant.");
		}
	}
	else
	{
		res = convert_to_string(double_value, current_locale_radix_character);
		if (backend.double_literal_suffix)
			res += "lf";
	}

	return res;
}